

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynArrayIndex *syntax)

{
  SynBase *pSVar1;
  Allocator *pAVar2;
  ArgumentData *pAVar3;
  int iVar4;
  ExprBase *value;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeBase *pTVar6;
  long lVar7;
  ExprBase **ppEVar8;
  char *__function;
  ulong uVar9;
  SynCallArgument *pSVar10;
  ExprError *unaff_R12;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  SmallArray<ArgumentData,_32U> arguments;
  SmallArray<ExprBase_*,_8U> local_6a0;
  SmallArray<ArgumentData,_32U> local_648;
  
  value = AnalyzeExpression(ctx,syntax->value);
  local_648.allocator = ctx->allocator;
  lVar7 = 0x20;
  do {
    *(undefined8 *)((long)local_6a0.little + lVar7 + 0x38) = 0;
    *(undefined1 *)((long)local_6a0.little + lVar7 + 0x40) = 0;
    *(undefined8 *)((long)local_648.little + lVar7 + -0x10) = 0;
    *(undefined8 *)((long)local_648.little + lVar7 + -8) = 0;
    *(undefined8 *)((long)&local_648.little[0].source + lVar7) = 0;
    *(undefined8 *)(&local_648.little[0].isExplicit + lVar7) = 0;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0x620);
  local_648.data = local_648.little;
  local_648.count = 0;
  local_648.max = 0x20;
  pSVar10 = (syntax->arguments).head;
  while (pSVar10 != (SynCallArgument *)0x0) {
    pEVar5 = AnalyzeExpression(ctx,pSVar10->value);
    pSVar1 = pEVar5->source;
    pTVar6 = pEVar5->type;
    unaff_R12 = (ExprError *)pSVar10->name;
    if (local_648.count == local_648.max) {
      SmallArray<ArgumentData,_32U>::grow(&local_648,local_648.count);
    }
    if (local_648.data == (ArgumentData *)0x0) {
      __function = 
      "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]";
      goto LAB_001f4b80;
    }
    uVar11 = (ulong)local_648.count;
    local_648.count = local_648.count + 1;
    local_648.data[uVar11].source = pSVar1;
    local_648.data[uVar11].isExplicit = false;
    local_648.data[uVar11].name = (SynIdentifier *)unaff_R12;
    local_648.data[uVar11].type = pTVar6;
    local_648.data[uVar11].value = pEVar5;
    local_648.data[uVar11].valueFunction = (FunctionData *)0x0;
    pSVar10 = (SynCallArgument *)(pSVar10->super_SynBase).next;
    if ((pSVar10 == (SynCallArgument *)0x0) || ((pSVar10->super_SynBase).typeID != 0x18)) {
      pSVar10 = (SynCallArgument *)0x0;
    }
  }
  if ((value->type == (TypeBase *)0x0) || (value->type->typeID != 0)) {
    uVar11 = (ulong)local_648.count;
    bVar12 = uVar11 != 0;
    if (bVar12) {
      ppEVar8 = &(local_648.data)->value;
      uVar9 = 1;
LAB_001f4933:
      if (((*ppEVar8)->type == (TypeBase *)0x0) || ((*ppEVar8)->type->typeID != 0))
      goto LAB_001f4949;
      local_6a0.allocator = ctx->allocator;
      local_6a0.data = local_6a0.little;
      local_6a0.count = 1;
      local_6a0.max = 8;
      local_6a0.little[0] = value;
      if (local_648.count != 0) {
        lVar7 = 0x20;
        uVar11 = 0;
        do {
          pAVar3 = local_648.data;
          if (local_6a0.count == local_6a0.max) {
            SmallArray<ExprBase_*,_8U>::grow(&local_6a0,local_6a0.count);
          }
          if (local_6a0.data == (ExprBase **)0x0) {
LAB_001f4b6b:
            __function = 
            "void SmallArray<ExprBase *, 8>::push_back(const T &) [T = ExprBase *, N = 8]";
LAB_001f4b80:
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,__function);
          }
          uVar9 = (ulong)local_6a0.count;
          local_6a0.count = local_6a0.count + 1;
          local_6a0.data[uVar9] = *(ExprBase **)((long)&pAVar3->source + lVar7);
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + 0x30;
        } while (uVar11 < local_648.count);
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      unaff_R12 = (ExprError *)CONCAT44(extraout_var_00,iVar4);
      pAVar2 = ctx->allocator;
      pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      arr_00.count = local_6a0.count;
      arr_00.data = local_6a0.data;
      arr_00._12_4_ = 0;
      ExprError::ExprError(unaff_R12,pAVar2,&syntax->super_SynBase,pTVar6,arr_00);
      SmallArray<ExprBase_*,_8U>::~SmallArray(&local_6a0);
    }
LAB_001f4b15:
    if (!bVar12) {
      arguments_00.count = local_648.count;
      arguments_00.data = local_648.data;
      arguments_00._12_4_ = 0;
      unaff_R12 = (ExprError *)CreateArrayIndex(ctx,&syntax->super_SynBase,value,arguments_00);
    }
  }
  else {
    local_6a0.allocator = ctx->allocator;
    local_6a0.data = local_6a0.little;
    local_6a0.count = 1;
    local_6a0.max = 8;
    local_6a0.little[0] = value;
    if (local_648.count != 0) {
      lVar7 = 0x20;
      uVar11 = 0;
      do {
        pAVar3 = local_648.data;
        if (local_6a0.count == local_6a0.max) {
          SmallArray<ExprBase_*,_8U>::grow(&local_6a0,local_6a0.count);
        }
        if (local_6a0.data == (ExprBase **)0x0) goto LAB_001f4b6b;
        uVar9 = (ulong)local_6a0.count;
        local_6a0.count = local_6a0.count + 1;
        local_6a0.data[uVar9] = *(ExprBase **)((long)&pAVar3->source + lVar7);
        uVar11 = uVar11 + 1;
        lVar7 = lVar7 + 0x30;
      } while (uVar11 < local_648.count);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    unaff_R12 = (ExprError *)CONCAT44(extraout_var,iVar4);
    pAVar2 = ctx->allocator;
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    arr.count = local_6a0.count;
    arr.data = local_6a0.data;
    arr._12_4_ = 0;
    ExprError::ExprError(unaff_R12,pAVar2,&syntax->super_SynBase,pTVar6,arr);
    SmallArray<ExprBase_*,_8U>::~SmallArray(&local_6a0);
  }
  SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
  return &unaff_R12->super_ExprBase;
LAB_001f4949:
  bVar12 = uVar9 < uVar11;
  ppEVar8 = ppEVar8 + 6;
  bVar13 = uVar9 == uVar11;
  uVar9 = uVar9 + 1;
  if (bVar13) goto LAB_001f4b15;
  goto LAB_001f4933;
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynArrayIndex *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	for(SynCallArgument *curr = syntax->arguments.head; curr; curr = getType<SynCallArgument>(curr->next))
	{
		ExprBase *index = AnalyzeExpression(ctx, curr->value);

		arguments.push_back(ArgumentData(index->source, false, curr->name, index->type, index));
	}

	if(isType<TypeError>(value->type))
	{
		SmallArray<ExprBase*, 8> values(ctx.allocator);

		values.push_back(value);

		for(unsigned i = 0; i < arguments.size(); i++)
			values.push_back(arguments[i].value);

		return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type))
		{
			SmallArray<ExprBase*, 8> values(ctx.allocator);

			values.push_back(value);

			for(unsigned i = 0; i < arguments.size(); i++)
				values.push_back(arguments[i].value);

			return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
		}
	}

	return CreateArrayIndex(ctx, syntax, value, arguments);
}